

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cpp
# Opt level: O0

void anon_unknown.dwarf_aa8::RemoveUnreliableCandidates
               (int f0_length,int number_of_candidates,double **f0_candidates,double **f0_scores)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double **tmp_f0_candidates_00;
  double *pdVar4;
  int local_40;
  int local_3c;
  int i_3;
  int j_1;
  int i_2;
  int j;
  int i_1;
  int i;
  double **tmp_f0_candidates;
  double **f0_scores_local;
  double **f0_candidates_local;
  int number_of_candidates_local;
  int f0_length_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)f0_length;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  tmp_f0_candidates_00 = (double **)operator_new__(uVar3);
  for (j = 0; j < f0_length; j = j + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)number_of_candidates;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pdVar4 = (double *)operator_new__(uVar3);
    tmp_f0_candidates_00[j] = pdVar4;
  }
  for (i_2 = 0; i_2 < f0_length; i_2 = i_2 + 1) {
    for (j_1 = 0; j_1 < number_of_candidates; j_1 = j_1 + 1) {
      tmp_f0_candidates_00[i_2][j_1] = f0_candidates[i_2][j_1];
    }
  }
  for (i_3 = 1; i_3 < f0_length + -1; i_3 = i_3 + 1) {
    for (local_3c = 0; local_3c < number_of_candidates; local_3c = local_3c + 1) {
      RemoveUnreliableCandidatesSub
                (i_3,local_3c,tmp_f0_candidates_00,number_of_candidates,f0_candidates,f0_scores);
    }
  }
  for (local_40 = 0; local_40 < f0_length; local_40 = local_40 + 1) {
    if (tmp_f0_candidates_00[local_40] != (double *)0x0) {
      operator_delete__(tmp_f0_candidates_00[local_40]);
    }
  }
  if (tmp_f0_candidates_00 != (double **)0x0) {
    operator_delete__(tmp_f0_candidates_00);
  }
  return;
}

Assistant:

static void RemoveUnreliableCandidates(int f0_length, int number_of_candidates,
    double **f0_candidates, double **f0_scores) {
  double **tmp_f0_candidates = new double *[f0_length];
  for (int i = 0; i < f0_length; ++i)
    tmp_f0_candidates[i] = new double[number_of_candidates];
  for (int i = 0; i < f0_length; ++i)
    for (int j = 0; j < number_of_candidates; ++j)
      tmp_f0_candidates[i][j] = f0_candidates[i][j];

  for (int i = 1; i < f0_length - 1; ++i)
    for (int j = 0; j < number_of_candidates; ++j)
      RemoveUnreliableCandidatesSub(i, j, tmp_f0_candidates,
          number_of_candidates, f0_candidates, f0_scores);

  for (int i = 0; i < f0_length; ++i) delete[] tmp_f0_candidates[i];
  delete[] tmp_f0_candidates;
}